

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_leaf(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  lysp_node *plVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  long *plVar8;
  lysp_ext_instance *plVar9;
  long lVar10;
  lysp_restr *must_p;
  long lVar11;
  lysp_ext_instance *plVar12;
  
  plVar2 = pnode[1].parent;
  if (plVar2 != (lysp_node *)0x0) {
    lVar10 = *(long *)(node + 1);
    if (lVar10 == 0) {
      lVar11 = 0;
      plVar8 = (long *)calloc(1,(long)plVar2[-1].exts * 0x38 + 8);
    }
    else {
      lVar11 = *(long *)(lVar10 + -8);
      plVar8 = (long *)realloc((void *)(lVar10 + -8),
                               ((long)&(plVar2[-1].exts)->name + *(long *)(lVar10 + -8) + lVar11) *
                               0x38 + 8);
    }
    if (plVar8 == (long *)0x0) {
      bVar4 = false;
      LVar7 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_leaf");
      bVar5 = true;
    }
    else {
      *(long **)(node + 1) = plVar8 + 1;
      LVar7 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar12 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar12 = pnode[1].parent[-1].exts;
      }
      memset(plVar8 + *plVar8 * 7 + 1,0,((long)&plVar12->name + lVar11) * 0x38);
      bVar4 = true;
      bVar5 = false;
    }
    if (bVar4) {
      plVar12 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar10 = 0;
      LVar6 = LVar7;
      do {
        LVar7 = LVar6;
        plVar2 = pnode[1].parent;
        if (plVar2 == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar2[-1].exts;
        }
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        if (plVar9 <= plVar12) {
          bVar5 = false;
          goto LAB_0014bd3e;
        }
        lVar11 = *(long *)(node + 1);
        uVar3 = *(ulong *)(lVar11 + -8);
        must_p = (lysp_restr *)((long)&plVar2->parent + lVar10);
        lVar10 = lVar10 + 0x40;
        *(ulong *)(lVar11 + -8) = uVar3 + 1;
        LVar7 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)((-(ulong)(lVar11 == 0) | uVar3) * 0x38 + lVar11));
        LVar6 = LY_SUCCESS;
      } while (LVar7 == LY_SUCCESS);
      bVar5 = true;
    }
LAB_0014bd3e:
    if (bVar5) {
      return LVar7;
    }
  }
  LVar7 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar7 == LY_SUCCESS) {
    if (pnode[2].exts != (lysp_ext_instance *)0x0) {
      LVar7 = lydict_insert(ctx->ctx,(char *)pnode[2].exts,0,(char **)&node[1].next);
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    LVar7 = lys_compile_node_type(ctx,pnode,(lysp_type *)&pnode[1].next,(lysc_node_leaf *)node);
    if (LVar7 == LY_SUCCESS) {
      if (pnode[3].parent != (lysp_node *)0x0) {
        LVar7 = lysc_unres_leaf_dflt_add(ctx,(lysc_node_leaf *)node,(lysp_qname *)(pnode + 3));
        if (LVar7 != LY_SUCCESS) {
          return LVar7;
        }
        pbVar1 = (byte *)((long)&node->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      LVar7 = LY_SUCCESS;
      if ((~node->flags & 0x220) == 0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory leaf with a default value.");
        LVar7 = LY_EVALID;
      }
    }
  }
  return LVar7;
}

Assistant:

static LY_ERR
lys_compile_node_leaf(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_leaf *leaf_p = (struct lysp_node_leaf *)pnode;
    struct lysc_node_leaf *leaf = (struct lysc_node_leaf *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, leaf_p->musts, leaf->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (leaf_p->units) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, leaf_p->units, 0, &leaf->units), done);
        leaf->flags |= LYS_SET_UNITS;
    }

    /* compile type */
    ret = lys_compile_node_type(ctx, pnode, &leaf_p->type, leaf);
    LY_CHECK_GOTO(ret, done);

    /* store/update default value */
    if (leaf_p->dflt.str) {
        LY_CHECK_RET(lysc_unres_leaf_dflt_add(ctx, leaf, &leaf_p->dflt));
        leaf->flags |= LYS_SET_DFLT;
    }

    /* checks */
    if ((leaf->flags & LYS_SET_DFLT) && (leaf->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid mandatory leaf with a default value.");
        return LY_EVALID;
    }

done:
    return ret;
}